

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ResbFree(Gia_ResbMan_t *p)

{
  Vec_IntFree(p->vUnateLits[0]);
  Vec_IntFree(p->vUnateLits[1]);
  Vec_IntFree(p->vNotUnateVars[0]);
  Vec_IntFree(p->vNotUnateVars[1]);
  Vec_IntFree(p->vUnatePairs[0]);
  Vec_IntFree(p->vUnatePairs[1]);
  Vec_IntFree(p->vUnateLitsW[0]);
  Vec_IntFree(p->vUnateLitsW[1]);
  Vec_IntFree(p->vUnatePairsW[0]);
  Vec_IntFree(p->vUnatePairsW[1]);
  Vec_IntFree(p->vBinateVars);
  Vec_IntFree(p->vGates);
  Vec_WrdFree(p->vSims);
  Vec_PtrFree(p->vDivs);
  Vec_WecFree(p->vSorter);
  if (p->pSets[0] != (word *)0x0) {
    free(p->pSets[0]);
    p->pSets[0] = (word *)0x0;
  }
  if (p->pSets[1] != (word *)0x0) {
    free(p->pSets[1]);
    p->pSets[1] = (word *)0x0;
  }
  if (p->pDivA != (word *)0x0) {
    free(p->pDivA);
    p->pDivA = (word *)0x0;
  }
  free(p->pDivB);
  free(p);
  return;
}

Assistant:

void Gia_ResbFree( Gia_ResbMan_t * p )
{
    Vec_IntFree( p->vUnateLits[0]    );
    Vec_IntFree( p->vUnateLits[1]    );
    Vec_IntFree( p->vNotUnateVars[0] );
    Vec_IntFree( p->vNotUnateVars[1] );
    Vec_IntFree( p->vUnatePairs[0]   );
    Vec_IntFree( p->vUnatePairs[1]   );
    Vec_IntFree( p->vUnateLitsW[0]   );
    Vec_IntFree( p->vUnateLitsW[1]   );
    Vec_IntFree( p->vUnatePairsW[0]  );
    Vec_IntFree( p->vUnatePairsW[1]  );
    Vec_IntFree( p->vBinateVars      );
    Vec_IntFree( p->vGates           );
    Vec_WrdFree( p->vSims            );
    Vec_PtrFree( p->vDivs            );
    Vec_WecFree( p->vSorter          );
    ABC_FREE( p->pSets[0] );
    ABC_FREE( p->pSets[1] );
    ABC_FREE( p->pDivA );
    ABC_FREE( p->pDivB );
    ABC_FREE( p );
}